

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O1

void __thiscall cmCPackeIFWUpdatesPatcher::EndElement(cmCPackeIFWUpdatesPatcher *this,string *name)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if ((iVar1 == 0) && (this->patched == false)) {
    cmCPackIFWRepository::WriteRepositoryUpdates(this->repository,this->xout);
    this->patched = true;
  }
  cmXMLWriter::EndElement(this->xout);
  if (this->patched == false) {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      cmCPackIFWRepository::WriteRepositoryUpdates(this->repository,this->xout);
      this->patched = true;
    }
  }
  return;
}

Assistant:

void EndElement(const std::string& name) CM_OVERRIDE
  {
    if (name == "Updates" && !this->patched) {
      this->repository->WriteRepositoryUpdates(this->xout);
      this->patched = true;
    }
    this->xout.EndElement();
    if (this->patched) {
      return;
    }
    if (name == "Checksum") {
      this->repository->WriteRepositoryUpdates(this->xout);
      this->patched = true;
    }
  }